

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O3

Vec_Ptr_t * Aig_ManMiterPartitioned(Aig_Man_t *p1,Aig_Man_t *p2,int nPartSize,int fSmart)

{
  uint uVar1;
  Vec_Int_t *vPart;
  Vec_Int_t *vSuppMap;
  void *pvVar2;
  Vec_Ptr_t *pVVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  Aig_Man_t *p;
  Aig_Obj_t *pDriver;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  Vec_Ptr_t *vPartSupps;
  Vec_Ptr_t *local_58;
  Vec_Ptr_t *local_50;
  Vec_Ptr_t *local_48;
  Aig_Man_t *local_40;
  Aig_Man_t *local_38;
  
  local_38 = p2;
  if (fSmart == 0) {
    pVVar3 = Aig_ManPartitionNaive(p1,nPartSize);
    local_58 = Aig_ManSupportNodes(p1,pVVar3);
  }
  else {
    pVVar3 = Aig_ManPartitionSmart(p1,nPartSize,0,&local_58);
  }
  uVar1 = pVVar3->nSize;
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  uVar10 = 8;
  if (6 < uVar1 - 1) {
    uVar10 = (ulong)uVar1;
  }
  pVVar4->nSize = 0;
  iVar9 = (int)uVar10;
  pVVar4->nCap = iVar9;
  if (iVar9 == 0) {
    ppvVar5 = (void **)0x0;
  }
  else {
    ppvVar5 = (void **)malloc((long)iVar9 << 3);
  }
  pVVar4->pArray = ppvVar5;
  if (0 < (int)uVar1) {
    uVar7 = 0;
    local_50 = pVVar4;
    local_48 = pVVar3;
    local_40 = p1;
    do {
      if ((long)local_58->nSize <= (long)uVar7) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      vPart = (Vec_Int_t *)pVVar3->pArray[uVar7];
      vSuppMap = (Vec_Int_t *)local_58->pArray[uVar7];
      p = Aig_ManStart(1000);
      if (0 < vSuppMap->nSize) {
        iVar9 = 0;
        do {
          Aig_ObjCreateCi(p);
          iVar9 = iVar9 + 1;
        } while (iVar9 < vSuppMap->nSize);
      }
      pVVar3 = Aig_ManDupPart(p,local_40,vPart,vSuppMap,0);
      pVVar4 = Aig_ManDupPart(p,local_38,vPart,vSuppMap,0);
      pDriver = Aig_MiterTwo(p,pVVar3,pVVar4);
      if (pVVar3->pArray != (void **)0x0) {
        free(pVVar3->pArray);
      }
      free(pVVar3);
      if (pVVar4->pArray != (void **)0x0) {
        free(pVVar4->pArray);
      }
      free(pVVar4);
      Aig_ObjCreateCo(p,pDriver);
      Aig_ManCleanup(p);
      pVVar3 = local_48;
      pVVar4 = local_50;
      iVar9 = (int)uVar10;
      if ((int)uVar7 == iVar9) {
        if (iVar9 < 0x10) {
          if (local_50->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(local_50->pArray,0x80);
          }
          pVVar4->pArray = ppvVar5;
          pVVar4->nCap = 0x10;
          uVar10 = 0x10;
        }
        else {
          uVar10 = (ulong)(uint)(iVar9 * 2);
          if (local_50->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(uVar10 * 8);
          }
          else {
            ppvVar5 = (void **)realloc(local_50->pArray,uVar10 * 8);
          }
          pVVar4->pArray = ppvVar5;
          pVVar4->nCap = iVar9 * 2;
        }
      }
      else {
        ppvVar5 = local_50->pArray;
      }
      uVar6 = uVar7 & 0xffffffff;
      uVar7 = uVar7 + 1;
      pVVar4->nSize = (int)uVar7;
      ppvVar5[uVar6] = p;
      uVar6 = (ulong)pVVar3->nSize;
    } while ((long)uVar7 < (long)uVar6);
    if (0 < pVVar3->nSize) {
      lVar8 = 0;
      do {
        pvVar2 = pVVar3->pArray[lVar8];
        if (pvVar2 != (void *)0x0) {
          if (*(void **)((long)pvVar2 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar2 + 8));
          }
          free(pvVar2);
          uVar6 = (ulong)(uint)pVVar3->nSize;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < (int)uVar6);
    }
  }
  if (pVVar3->pArray != (void **)0x0) {
    free(pVVar3->pArray);
  }
  free(pVVar3);
  pVVar3 = local_58;
  iVar9 = local_58->nSize;
  if (0 < iVar9) {
    lVar8 = 0;
    do {
      pvVar2 = pVVar3->pArray[lVar8];
      if (pvVar2 != (void *)0x0) {
        if (*(void **)((long)pvVar2 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar2 + 8));
        }
        free(pvVar2);
        iVar9 = pVVar3->nSize;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < iVar9);
  }
  if (pVVar3->pArray != (void **)0x0) {
    free(pVVar3->pArray);
  }
  free(pVVar3);
  return pVVar4;
}

Assistant:

Vec_Ptr_t * Aig_ManMiterPartitioned( Aig_Man_t * p1, Aig_Man_t * p2, int nPartSize, int fSmart )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pMiter;
    Vec_Ptr_t * vMiters, * vNodes1, * vNodes2;
    Vec_Ptr_t * vParts, * vPartSupps;
    Vec_Int_t * vPart, * vPartSupp;
    int i, k;
    // partition the first manager
    if ( fSmart )
        vParts = Aig_ManPartitionSmart( p1, nPartSize, 0, &vPartSupps );
    else
    {
        vParts = Aig_ManPartitionNaive( p1, nPartSize );
        vPartSupps = Aig_ManSupportNodes( p1, vParts );
    }
    // derive miters
    vMiters = Vec_PtrAlloc( Vec_PtrSize(vParts) );
    for ( i = 0; i < Vec_PtrSize(vParts); i++ )
    {
        // get partition and its support
        vPart     = (Vec_Int_t *)Vec_PtrEntry( vParts, i );
        vPartSupp = (Vec_Int_t *)Vec_PtrEntry( vPartSupps, i );
        // create the new miter
        pNew = Aig_ManStart( 1000 );
        // create the PIs
        for ( k = 0; k < Vec_IntSize(vPartSupp); k++ )
            Aig_ObjCreateCi( pNew );
        // copy the components
        vNodes1 = Aig_ManDupPart( pNew, p1, vPart, vPartSupp, 0 );
        vNodes2 = Aig_ManDupPart( pNew, p2, vPart, vPartSupp, 0 );
        // create the miter
        pMiter = Aig_MiterTwo( pNew, vNodes1, vNodes2 );
        Vec_PtrFree( vNodes1 );
        Vec_PtrFree( vNodes2 );
        // create the output
        Aig_ObjCreateCo( pNew, pMiter );
        // clean up
        Aig_ManCleanup( pNew );
        Vec_PtrPush( vMiters, pNew );
    }
    Vec_VecFree( (Vec_Vec_t *)vParts );
    Vec_VecFree( (Vec_Vec_t *)vPartSupps );
    return vMiters;
}